

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RC interp(NODE *n)

{
  NODE *n_00;
  bool bVar1;
  int iVar2;
  AttrType AVar3;
  int nConditions;
  int iVar4;
  RC RVar5;
  size_t sVar6;
  node *pnVar7;
  AttrType *pAVar8;
  char **ppcVar9;
  Condition *extraout_RDX;
  Condition *extraout_RDX_00;
  long lVar10;
  Condition *pCVar11;
  Condition *pCVar12;
  char *pcVar13;
  char *pcVar14;
  node *pnVar15;
  int *piVar16;
  AttrType local_ccc;
  RelAttr local_cc8;
  char c;
  char *local_cb0 [39];
  RelAttr relAttr;
  AttrInfo attrInfos [40];
  
  iVar2 = isatty(0);
  pCVar11 = extraout_RDX;
  if (iVar2 != 0) goto LAB_0011b1ca;
  switch(n->kind) {
  case N_CREATETABLE:
    printf("create table %s (",(n->u).CREATETABLE.relname);
    for (pnVar7 = (n->u).CREATETABLE.attrlist; pnVar7 != (node *)0x0;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist) {
      pnVar15 = (pnVar7->u).QUERY.relattrlist;
      printf("%s = %s",(pnVar15->u).CREATETABLE.relname,(pnVar15->u).CREATETABLE.attrlist);
      if ((pnVar7->u).CREATETABLE.attrlist != (node *)0x0) {
        printf(", ");
      }
    }
    putchar(0x29);
    break;
  case N_CREATEINDEX:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "create index %s(%s);\n";
    goto LAB_0011b074;
  case N_DROPTABLE:
    pcVar14 = (n->u).CREATETABLE.relname;
    pcVar13 = "drop table %s;\n";
    goto LAB_0011b048;
  case N_DROPINDEX:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "drop index %s(%s);\n";
    goto LAB_0011b074;
  case N_LOAD:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "load %s(\"%s\");\n";
    goto LAB_0011b074;
  case N_SET:
    pcVar14 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar13 = "set %s = \"%s\";\n";
LAB_0011b074:
    printf(pcVar13,pcVar14,pnVar7);
    goto switchD_0011af13_default;
  case N_HELP:
    printf("help");
    if ((n->u).CREATETABLE.relname != (char *)0x0) {
      printf(" %s");
    }
    break;
  case N_PRINT:
    pcVar14 = (n->u).CREATETABLE.relname;
    pcVar13 = "print %s;\n";
LAB_0011b048:
    printf(pcVar13,pcVar14);
    goto switchD_0011af13_default;
  case N_QUERY:
    printf("select ");
    for (pnVar7 = (n->u).QUERY.relattrlist; pnVar7 != (node *)0x0;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist) {
      print_relattr((pnVar7->u).QUERY.relattrlist);
      if ((pnVar7->u).CREATETABLE.attrlist != (node *)0x0) {
        putchar(0x2c);
      }
    }
    printf("\n from ");
    for (pnVar7 = (n->u).CREATETABLE.attrlist; pnVar7 != (node *)0x0;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist) {
      printf(" %s",(((pnVar7->u).QUERY.relattrlist)->u).CREATETABLE.relname);
      if ((pnVar7->u).CREATETABLE.attrlist != (node *)0x0) {
        putchar(0x2c);
      }
    }
    putchar(10);
    if ((n->u).QUERY.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar7 = (n->u).QUERY.conditionlist;
LAB_0011b1aa:
      print_conditions(pnVar7);
    }
    break;
  case N_INSERT:
    printf("insert into %s values ( ",(n->u).CREATETABLE.relname);
    for (pnVar7 = (n->u).CREATETABLE.attrlist; pnVar7 != (node *)0x0;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist) {
      print_value((pnVar7->u).QUERY.relattrlist);
      if ((pnVar7->u).CREATETABLE.attrlist != (node *)0x0) {
        putchar(0x2c);
      }
    }
    pcVar14 = ");";
    goto LAB_0011b1b6;
  case N_DELETE:
    printf("delete %s ",(n->u).CREATETABLE.relname);
    if ((n->u).CREATETABLE.attrlist != (node *)0x0) {
      printf("where ");
      pnVar7 = (n->u).CREATETABLE.attrlist;
      goto LAB_0011b1aa;
    }
    break;
  case N_UPDATE:
    printf("update %s set ",(n->u).CREATETABLE.relname);
    print_relattr((n->u).CREATETABLE.attrlist);
    printf(" = ");
    pnVar7 = (n->u).QUERY.conditionlist;
    n_00 = (pnVar7->u).QUERY.relattrlist;
    if (n_00 == (NODE *)0x0) {
      print_value((pnVar7->u).CREATETABLE.attrlist);
    }
    else {
      print_relattr(n_00);
    }
    if ((n->u).UPDATE.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar7 = (n->u).UPDATE.conditionlist;
      goto LAB_0011b1aa;
    }
    break;
  default:
    goto switchD_0011af13_default;
  }
  pcVar14 = ";";
LAB_0011b1b6:
  puts(pcVar14);
switchD_0011af13_default:
  fflush(_stdout);
  pCVar11 = extraout_RDX_00;
LAB_0011b1ca:
  switch(n->kind) {
  case N_CREATETABLE:
    sVar6 = strlen((n->u).CREATETABLE.relname);
    if (0x18 < sVar6) {
      interp();
      return 0;
    }
    pnVar7 = (n->u).CREATETABLE.attrlist;
    if (pnVar7 == (node *)0x0) {
      iVar4 = 0;
    }
    else {
      piVar16 = &attrInfos[0].attrLength;
      lVar10 = 0;
      do {
        if (lVar10 == 0x28) {
          iVar4 = -2;
          goto LAB_0011b77f;
        }
        pnVar15 = (pnVar7->u).QUERY.relattrlist;
        sVar6 = strlen((pnVar15->u).CREATETABLE.relname);
        if (0x18 < sVar6) {
          iVar4 = -9;
          goto LAB_0011b77f;
        }
        bVar1 = false;
        iVar2 = __isoc99_sscanf((pnVar15->u).CREATETABLE.attrlist,"%c%d",&c,&relAttr);
        iVar4 = -6;
        if (iVar2 == 2) {
          bVar1 = false;
          AVar3 = _c & 0xff;
          if ((_c & 0xff) < 0x6d) {
            if (AVar3 == 99) {
LAB_0011b31c:
              local_ccc = STRING;
              if (0xffffff00 < (int)relAttr.relName - 0x100U) goto LAB_0011b395;
              iVar4 = -7;
            }
            else if (AVar3 == 0x66) {
LAB_0011b355:
              local_ccc = FLOAT;
              if ((int)relAttr.relName == 4) goto LAB_0011b395;
              iVar4 = -5;
            }
            else {
              if (AVar3 != 0x69) goto LAB_0011b3a4;
              local_ccc = INT;
              if ((int)relAttr.relName == 4) goto LAB_0011b395;
              iVar4 = -4;
            }
          }
          else {
            if ((_c & 0xff) != 0x6d) {
              if (AVar3 == 0x72) goto LAB_0011b355;
              if (AVar3 != 0x73) goto LAB_0011b3a4;
              goto LAB_0011b31c;
            }
            local_ccc = MBR;
            if ((int)relAttr.relName == 4) goto LAB_0011b395;
            iVar4 = -0xb;
          }
LAB_0011b3a1:
          bVar1 = false;
        }
        else if (iVar2 == 1) {
          bVar1 = false;
          AVar3 = _c & 0xff;
          iVar4 = -6;
          if ((_c & 0xff) < 0x6d) {
            if (AVar3 != 99) {
              if (AVar3 == 0x66) {
LAB_0011b340:
                relAttr.relName = (char *)CONCAT44(relAttr.relName._4_4_,4);
                local_ccc = FLOAT;
              }
              else {
                if (AVar3 != 0x69) goto LAB_0011b3a1;
                relAttr.relName = (char *)CONCAT44(relAttr.relName._4_4_,4);
                local_ccc = INT;
              }
LAB_0011b395:
              iVar4 = 0;
              bVar1 = true;
              goto LAB_0011b3a4;
            }
          }
          else {
            if ((_c & 0xff) == 0x6d) {
              relAttr.relName = (char *)CONCAT44(relAttr.relName._4_4_,4);
              local_ccc = MBR;
              goto LAB_0011b395;
            }
            if (AVar3 == 0x72) goto LAB_0011b340;
            if (AVar3 != 0x73) goto LAB_0011b3a1;
          }
          iVar4 = -3;
        }
LAB_0011b3a4:
        if (!bVar1) goto LAB_0011b77f;
        ((AttrInfo *)(piVar16 + -3))->attrName = (pnVar15->u).CREATETABLE.relname;
        piVar16[-1] = local_ccc;
        *piVar16 = (int)relAttr.relName;
        lVar10 = lVar10 + 1;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist;
        piVar16 = piVar16 + 4;
      } while (pnVar7 != (node *)0x0);
      iVar4 = (int)lVar10;
    }
LAB_0011b77f:
    if (-1 < iVar4) {
      RVar5 = SM_Manager::CreateTable(pSmm,(n->u).CREATETABLE.relname,iVar4,attrInfos);
      return RVar5;
    }
    pcVar14 = "create";
    break;
  case N_CREATEINDEX:
    RVar5 = SM_Manager::CreateIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar5;
  case N_DROPTABLE:
    RVar5 = SM_Manager::DropTable(pSmm,(n->u).CREATETABLE.relname);
    return RVar5;
  case N_DROPINDEX:
    RVar5 = SM_Manager::DropIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar5;
  case N_LOAD:
    RVar5 = SM_Manager::Load(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar5;
  case N_SET:
    RVar5 = SM_Manager::Set(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar5;
  case N_HELP:
    pcVar14 = (n->u).CREATETABLE.relname;
    if (pcVar14 == (char *)0x0) {
      RVar5 = SM_Manager::Help(pSmm);
      return RVar5;
    }
    RVar5 = SM_Manager::Help(pSmm,pcVar14);
    return RVar5;
  case N_PRINT:
    RVar5 = SM_Manager::Print(pSmm,(n->u).CREATETABLE.relname);
    return RVar5;
  case N_QUERY:
    pnVar7 = (n->u).QUERY.relattrlist;
    if (pnVar7 == (node *)0x0) {
      lVar10 = 0;
    }
    else {
      ppcVar9 = &relAttr.attrName;
      lVar10 = 0;
      do {
        if (lVar10 == 0x28) {
          lVar10 = 0xfffffffe;
          break;
        }
        pnVar15 = (pnVar7->u).QUERY.relattrlist;
        ((RelAttr *)(ppcVar9 + -1))->relName = (pnVar15->u).CREATETABLE.relname;
        pCVar11 = (Condition *)(pnVar15->u).CREATETABLE.attrlist;
        *ppcVar9 = (char *)pCVar11;
        lVar10 = lVar10 + 1;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist;
        ppcVar9 = ppcVar9 + 2;
      } while (pnVar7 != (node *)0x0);
    }
    iVar4 = (int)lVar10;
    if (iVar4 < 0) {
      pcVar14 = "select";
    }
    else {
      lVar10 = 0;
      for (pnVar7 = (n->u).CREATETABLE.attrlist; pnVar7 != (node *)0x0;
          pnVar7 = (pnVar7->u).CREATETABLE.attrlist) {
        if (lVar10 == 0x28) {
          lVar10 = 0xfffffffe;
          break;
        }
        *(char **)(&c + lVar10 * 8) = (((pnVar7->u).QUERY.relattrlist)->u).CREATETABLE.relname;
        lVar10 = lVar10 + 1;
      }
      iVar2 = (int)lVar10;
      if (iVar2 < 0) {
        pcVar14 = "select";
        iVar4 = iVar2;
      }
      else {
        nConditions = mk_conditions((n->u).QUERY.conditionlist,(int)(Condition *)attrInfos,pCVar11);
        if (-1 < nConditions) {
          RVar5 = QL_Manager::Select(pQlm,iVar4,&relAttr,iVar2,(char **)&c,nConditions,
                                     (Condition *)attrInfos);
          return RVar5;
        }
        pcVar14 = "select";
        iVar4 = nConditions;
      }
    }
    break;
  case N_INSERT:
    pnVar7 = (n->u).CREATETABLE.attrlist;
    if (pnVar7 == (node *)0x0) {
      lVar10 = 0;
    }
    else {
      pAVar8 = &attrInfos[0].attrType;
      lVar10 = 0;
      do {
        if (lVar10 == 0x28) {
          lVar10 = 0xfffffffe;
          break;
        }
        pnVar15 = (pnVar7->u).QUERY.relattrlist;
        AVar3 = (pnVar15->u).VALUE.type;
        *(AttrType *)&((AttrInfo *)(pAVar8 + -2))->attrName = AVar3;
        switch(AVar3) {
        case INT:
          pnVar15 = (node *)((long)&pnVar15->u + 4);
          break;
        case FLOAT:
          pnVar15 = (node *)((long)&pnVar15->u + 8);
          break;
        case STRING:
          pnVar15 = (pnVar15->u).QUERY.conditionlist;
          break;
        case MBR:
          pnVar15 = (node *)((long)&pnVar15->u + 0x18);
          break;
        default:
          goto switchD_0011b491_default;
        }
        *(node **)pAVar8 = pnVar15;
switchD_0011b491_default:
        lVar10 = lVar10 + 1;
        pnVar7 = (pnVar7->u).CREATETABLE.attrlist;
        pAVar8 = pAVar8 + 4;
      } while (pnVar7 != (node *)0x0);
    }
    iVar4 = (int)lVar10;
    if (-1 < iVar4) {
      RVar5 = QL_Manager::Insert(pQlm,(n->u).CREATETABLE.relname,iVar4,(Value *)attrInfos);
      return RVar5;
    }
    pcVar14 = "insert";
    break;
  case N_DELETE:
    iVar2 = mk_conditions((n->u).CREATETABLE.attrlist,(int)attrInfos,pCVar11);
    if (-1 < iVar2) {
      RVar5 = QL_Manager::Delete(pQlm,(n->u).CREATETABLE.relname,iVar2,(Condition *)attrInfos);
      return RVar5;
    }
    print_error("delete",iVar2);
    return 0;
  case N_UPDATE:
    pnVar7 = (n->u).CREATETABLE.attrlist;
    relAttr.relName = (pnVar7->u).CREATETABLE.relname;
    relAttr.attrName = (pnVar7->u).CREATEINDEX.attrname;
    pnVar7 = (n->u).QUERY.conditionlist;
    pnVar15 = (pnVar7->u).QUERY.relattrlist;
    if (pnVar15 == (node *)0x0) {
      pnVar7 = (pnVar7->u).CREATETABLE.attrlist;
      _c = (pnVar7->u).VALUE.type;
      pCVar11 = (Condition *)(ulong)_c;
      if (pCVar11 < (Condition *)0x4) {
        ppcVar9 = local_cb0;
        pCVar12 = (Condition *)
                  ((long)&switchD_0011b65c::switchdataD_0011e85c +
                  (long)(int)(&switchD_0011b65c::switchdataD_0011e85c)[(long)pCVar11]);
        switch(pCVar11) {
        case (Condition *)0x0:
          pnVar7 = (node *)((long)&pnVar7->u + 4);
          break;
        case (Condition *)0x1:
          pnVar7 = (node *)((long)&pnVar7->u + 8);
          break;
        case (Condition *)0x2:
          pnVar7 = (pnVar7->u).QUERY.conditionlist;
          break;
        case (Condition *)0x3:
          pnVar7 = (node *)((long)&pnVar7->u + 0x18);
        }
        iVar2 = 1;
        goto LAB_0011b7cb;
      }
      iVar2 = 1;
    }
    else {
      ppcVar9 = &local_cc8.attrName;
      pCVar12 = (Condition *)(pnVar15->u).QUERY.relattrlist;
      pnVar7 = (pnVar15->u).CREATETABLE.attrlist;
      iVar2 = 0;
      local_cc8.relName = (char *)pCVar12;
LAB_0011b7cb:
      *ppcVar9 = (char *)pnVar7;
      pCVar11 = pCVar12;
    }
    iVar4 = mk_conditions((n->u).UPDATE.conditionlist,(int)(Condition *)attrInfos,pCVar11);
    if (-1 < iVar4) {
      RVar5 = QL_Manager::Update(pQlm,(n->u).CREATETABLE.relname,&relAttr,iVar2,&local_cc8,
                                 (Value *)&c,iVar4,(Condition *)attrInfos);
      return RVar5;
    }
    pcVar14 = "update";
    break;
  default:
    goto switchD_0011b1e4_default;
  }
  print_error(pcVar14,iVar4);
switchD_0011b1e4_default:
  return 0;
}

Assistant:

RC interp(NODE *n)
{
   RC errval = 0;         /* returned error value      */

   /* if input not coming from a terminal, then echo the query */
   if(!isatty(0))
      echo_query(n);

   switch(n -> kind){

      case N_CREATETABLE:            /* for CreateTable() */
         {
            int nattrs;
            AttrInfo attrInfos[MAXATTRS];

            /* Make sure relation name isn't too long */
            if(strlen(n -> u.CREATETABLE.relname) > MAXNAME){
               print_error((char*)"create", E_TOOLONG);
               break;
            }

            /* Make a list of AttrInfos suitable for sending to Create */
            nattrs = mk_attr_infos(n -> u.CREATETABLE.attrlist, MAXATTRS, 
                  attrInfos);
            if(nattrs < 0){
               print_error((char*)"create", nattrs);
               break;
            }

            /* Make the call to create */
            errval = pSmm->CreateTable(n->u.CREATETABLE.relname, nattrs, 
                  attrInfos);
            break;
         }   

      case N_CREATEINDEX:            /* for CreateIndex() */

         errval = pSmm->CreateIndex(n->u.CREATEINDEX.relname,
               n->u.CREATEINDEX.attrname);
         break;

      case N_DROPINDEX:            /* for DropIndex() */

         errval = pSmm->DropIndex(n->u.DROPINDEX.relname,
               n->u.DROPINDEX.attrname);
         break;

      case N_DROPTABLE:            /* for DropTable() */

         errval = pSmm->DropTable(n->u.DROPTABLE.relname);
         break;

      case N_LOAD:            /* for Load() */

         errval = pSmm->Load(n->u.LOAD.relname,
               n->u.LOAD.filename);
         break;

      case N_SET:                    /* for Set() */

         errval = pSmm->Set(n->u.SET.paramName,
               n->u.SET.string);
         break;

      case N_HELP:            /* for Help() */

         if (n->u.HELP.relname)
            errval = pSmm->Help(n->u.HELP.relname);
         else
            errval = pSmm->Help();
         break;

      case N_PRINT:            /* for Print() */

         errval = pSmm->Print(n->u.PRINT.relname);
         break;

      case N_QUERY:            /* for Query() */
         {
            int       nSelAttrs = 0;
            RelAttr  relAttrs[MAXATTRS];
            int       nRelations = 0;
            char      *relations[MAXATTRS];
            int       nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of RelAttrs suitable for sending to Query */
            nSelAttrs = mk_rel_attrs(n->u.QUERY.relattrlist, MAXATTRS,
                  relAttrs);
            if(nSelAttrs < 0){
               print_error((char*)"select", nSelAttrs);
               break;
            }

            /* Make a list of relation names suitable for sending to Query */
            nRelations = mk_relations(n->u.QUERY.rellist, MAXATTRS, relations);
            if(nRelations < 0){
               print_error((char*)"select", nRelations);
               break;
            }

            /* Make a list of Conditions suitable for sending to Query */
            nConditions = mk_conditions(n->u.QUERY.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"select", nConditions);
               break;
            }

            /* Make the call to Select */
            errval = pQlm->Select(nSelAttrs, relAttrs,
                  nRelations, relations,
                  nConditions, conditions);
            break;
         }   

      case N_INSERT:            /* for Insert() */
         {
            int nValues = 0;
            Value values[MAXATTRS];

            /* Make a list of Values suitable for sending to Insert */
            nValues = mk_values(n->u.INSERT.valuelist, MAXATTRS, values);
            if(nValues < 0){
               print_error((char*)"insert", nValues);
               break;
            }

            /* Make the call to insert */
            errval = pQlm->Insert(n->u.INSERT.relname,
                  nValues, values);
            break;
         }   

      case N_DELETE:            /* for Delete() */
         {
            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of Conditions suitable for sending to delete */
            nConditions = mk_conditions(n->u.DELETE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"delete", nConditions);
               break;
            }

            /* Make the call to delete */
            errval = pQlm->Delete(n->u.DELETE.relname,
                  nConditions, conditions);
            break;
         }   

      case N_UPDATE:            /* for Update() */
         {
            RelAttr relAttr;

            // The RHS can be either a value or an attribute
            Value rhsValue;
            RelAttr rhsRelAttr;
            int bIsValue;

            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a RelAttr suitable for sending to Update */
            mk_rel_attr(n->u.UPDATE.relattr, relAttr);

            struct node *rhs = n->u.UPDATE.relorvalue;
            if (rhs->u.RELATTR_OR_VALUE.relattr) {
               mk_rel_attr(rhs->u.RELATTR_OR_VALUE.relattr, rhsRelAttr);
               bIsValue = 0;
            } else {
               /* Make a value suitable for sending to update */
               mk_value(rhs->u.RELATTR_OR_VALUE.value, rhsValue);
               bIsValue = 1;
            }

            /* Make a list of Conditions suitable for sending to Update */
            nConditions = mk_conditions(n->u.UPDATE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"update", nConditions);
               break;
            }

            /* Make the call to update */
            errval = pQlm->Update(n->u.UPDATE.relname, relAttr, bIsValue, 
                  rhsRelAttr, rhsValue, nConditions, conditions);
            break;
         }   

      default:   // should never get here
         break;
   }

   return (errval);
}